

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_out_scope.cpp
# Opt level: O2

void __thiscall A::A(A *this,A *other)

{
  char *pcVar1;
  ostream *poVar2;
  
  this->n_ = other->n_;
  pcVar1 = other->name_;
  this->c = other->c;
  this->name_ = pcVar1;
  spin_mutex_t::lock(&my_io_mutex);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Moving ");
  poVar2 = std::operator<<(poVar2,this->name_);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  other->c = (float *)0x0;
  return;
}

Assistant:

A(A&& other)
  : n_(other.n_), c(other.c), name_(other.name_)
  {
    LOG("Moving " << name_);
    other.c = 0;
  }